

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

void __thiscall
spvtools::val::Function::RegisterBlockEnd
          (Function *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *next_list)

{
  iterator __position;
  Function *this_00;
  BasicBlock **ppBVar1;
  vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *this_01;
  Construct *this_02;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *pvVar2;
  uint32_t *puVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar4;
  uint32_t successor_id;
  __hashtable *__h_1;
  __hashtable *__h;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> next_blocks;
  BasicBlock *continue_target;
  uint32_t local_1c4;
  Function *local_1c0;
  BasicBlock **local_1b8;
  BasicBlock *local_1b0;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1a8;
  uint32_t *local_1a0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> local_198;
  BasicBlock *local_178;
  BasicBlock local_170;
  BasicBlock local_d0;
  
  if (this->current_block_ != (BasicBlock *)0x0) {
    local_1b8 = &this->current_block_;
    local_198.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c0 = this;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              (&local_198,
               (long)(next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    puVar3 = (next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_1a0 = (next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_finish;
    if (puVar3 != local_1a0) {
      local_1a8 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&local_1c0->blocks_;
      local_1b0 = (BasicBlock *)&local_1c0->undefined_blocks_;
      do {
        local_1c4 = *puVar3;
        BasicBlock::BasicBlock(&local_d0,local_1c4);
        local_178 = (BasicBlock *)CONCAT44(local_178._4_4_,local_1c4);
        local_170.immediate_structural_dominator_ = local_d0.immediate_structural_dominator_;
        local_170.immediate_structural_post_dominator_ =
             local_d0.immediate_structural_post_dominator_;
        local_170.id_ = local_d0.id_;
        local_170._4_4_ = local_d0._4_4_;
        local_170.immediate_dominator_ = local_d0.immediate_dominator_;
        local_170.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_d0.predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_170.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_d0.predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_170.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d0.predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d0.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d0.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0.predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_d0.successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_170.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_d0.successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_170.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d0.successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d0.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d0.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0.successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170.label_._0_4_ = local_d0.label_._0_4_;
        local_170.label_._4_4_ = local_d0.label_._4_4_;
        local_170.terminator_._0_4_ = local_d0.terminator_._0_4_;
        local_170.terminator_._4_4_ = local_d0.terminator_._4_4_;
        local_170.type_.super__Base_bitset<1UL>._M_w = local_d0.type_.super__Base_bitset<1UL>._M_w;
        local_170.reachable_ = local_d0.reachable_;
        local_170.structurally_reachable_ = local_d0.structurally_reachable_;
        local_170._90_6_ = local_d0._90_6_;
        local_170.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_d0.structural_predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_170.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_d0.structural_predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_170.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d0.structural_predecessors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d0.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d0.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0.structural_predecessors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_d0.structural_successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_170.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
             local_d0.structural_successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        local_170.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
             local_d0.structural_successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish._4_4_;
        local_170.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             local_d0.structural_successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        local_170.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             local_d0.structural_successors_.
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_d0.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d0.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0.structural_successors_.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pVar4 = std::
                _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>
                          (local_1a8,&local_178);
        if (local_170.structural_successors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.structural_successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(local_170.structural_successors_.
                                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   local_170.structural_successors_.
                                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)local_170.structural_successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.structural_predecessors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_170.structural_predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.structural_predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.successors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_170.successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.predecessors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_170.predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.structural_successors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.structural_successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.structural_successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.structural_successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.structural_predecessors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.structural_predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.structural_predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.successors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.successors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.predecessors_.
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.predecessors_.
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_178 = local_1b0;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_1b0,
                     (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_1c4,&local_178);
        }
        local_178 = (BasicBlock *)
                    ((long)pVar4.first.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                    + 0x10);
        std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
        emplace_back<spvtools::val::BasicBlock*>
                  ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                   &local_198,&local_178);
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_1a0);
    }
    ppBVar1 = local_1b8;
    this_00 = local_1c0;
    if ((((*local_1b8)->type_).super__Base_bitset<1UL>._M_w & 4) != 0) {
      this_01 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                std::__detail::
                _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_1c0->loop_header_successors_plus_continue_target_map_,
                             local_1b8);
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      operator=((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )this_01,&local_198);
      this_02 = FindConstructForEntryBlock(this_00,this_00->current_block_,kLoop);
      pvVar2 = Construct::corresponding_constructs(this_02);
      local_178 = Construct::entry_block
                            ((pvVar2->
                             super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish[-1]);
      if (local_178 != this_00->current_block_) {
        __position._M_current = *(BasicBlock ***)(this_01 + 8);
        if (__position._M_current == *(BasicBlock ***)(this_01 + 0x10)) {
          std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
          _M_realloc_insert<spvtools::val::BasicBlock*const&>(this_01,__position,&local_178);
        }
        else {
          *__position._M_current = local_178;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
      }
    }
    BasicBlock::RegisterSuccessors(*ppBVar1,&local_198);
    *ppBVar1 = (BasicBlock *)0x0;
    if (local_198.
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("current_block_ && \"RegisterBlockEnd can only be called when parsing a binary in a block\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                ,0x91,"void spvtools::val::Function::RegisterBlockEnd(std::vector<uint32_t>)");
}

Assistant:

void Function::RegisterBlockEnd(std::vector<uint32_t> next_list) {
  assert(
      current_block_ &&
      "RegisterBlockEnd can only be called when parsing a binary in a block");
  std::vector<BasicBlock*> next_blocks;
  next_blocks.reserve(next_list.size());

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success;
  for (uint32_t successor_id : next_list) {
    tie(inserted_block, success) =
        blocks_.insert({successor_id, BasicBlock(successor_id)});
    if (success) {
      undefined_blocks_.insert(successor_id);
    }
    next_blocks.push_back(&inserted_block->second);
  }

  if (current_block_->is_type(kBlockTypeLoop)) {
    // For each loop header, record the set of its successors, and include
    // its continue target if the continue target is not the loop header
    // itself.
    std::vector<BasicBlock*>& next_blocks_plus_continue_target =
        loop_header_successors_plus_continue_target_map_[current_block_];
    next_blocks_plus_continue_target = next_blocks;
    auto continue_target =
        FindConstructForEntryBlock(current_block_, ConstructType::kLoop)
            .corresponding_constructs()
            .back()
            ->entry_block();
    if (continue_target != current_block_) {
      next_blocks_plus_continue_target.push_back(continue_target);
    }
  }

  current_block_->RegisterSuccessors(next_blocks);
  current_block_ = nullptr;
  return;
}